

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O1

int Abc_NtkMinimumBase2(Abc_Ntk_t *pNtk)

{
  void **ppvVar1;
  void *pvVar2;
  Abc_Obj_t *pNode;
  long *plVar3;
  int iVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  int iVar8;
  
  if ((pNtk->ntkFunc == ABC_FUNC_BDD) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    lVar5 = (long)pNtk->vObjs->nSize;
    if (0 < lVar5) {
      ppvVar1 = pNtk->vObjs->pArray;
      lVar7 = 0;
      do {
        pvVar2 = ppvVar1[lVar7];
        if (pvVar2 != (void *)0x0) {
          *(undefined4 *)((long)pvVar2 + 0x2c) = 0;
        }
        lVar7 = lVar7 + 1;
      } while (lVar5 != lVar7);
    }
    pVVar6 = pNtk->vObjs;
    if (pVVar6->nSize < 1) {
      iVar8 = 0;
    }
    else {
      lVar5 = 0;
      iVar8 = 0;
      do {
        pNode = (Abc_Obj_t *)pVVar6->pArray[lVar5];
        if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
          iVar4 = Abc_NodeMinimumBase2(pNode);
          iVar8 = iVar8 + iVar4;
        }
        lVar5 = lVar5 + 1;
        pVVar6 = pNtk->vObjs;
      } while (lVar5 < pVVar6->nSize);
    }
    pVVar6 = pNtk->vObjs;
    if (0 < pVVar6->nSize) {
      lVar5 = 0;
      do {
        plVar3 = (long *)pVVar6->pArray[lVar5];
        if ((plVar3 != (long *)0x0) && (0 < *(int *)((long)plVar3 + 0x1c))) {
          lVar7 = 0;
          do {
            Vec_IntPush((Vec_Int_t *)
                        (*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                  (long)*(int *)(plVar3[4] + lVar7 * 4) * 8) + 0x28),(int)plVar3[2])
            ;
            lVar7 = lVar7 + 1;
          } while (lVar7 < *(int *)((long)plVar3 + 0x1c));
        }
        lVar5 = lVar5 + 1;
        pVVar6 = pNtk->vObjs;
      } while (lVar5 < pVVar6->nSize);
    }
    return iVar8;
  }
  __assert_fail("Abc_NtkIsBddLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCollapse.c"
                ,0x5f,"int Abc_NtkMinimumBase2(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkMinimumBase2( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode, * pFanin;
    int i, k, Counter;
    assert( Abc_NtkIsBddLogic(pNtk) );
    // remove all fanouts
    Abc_NtkForEachObj( pNtk, pNode, i )
        Vec_IntClear( &pNode->vFanouts );
    // add useful fanins
    Counter = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
        Counter += Abc_NodeMinimumBase2( pNode );
    // add fanouts
    Abc_NtkForEachObj( pNtk, pNode, i )
        Abc_ObjForEachFanin( pNode, pFanin, k )
            Vec_IntPush( &pFanin->vFanouts, Abc_ObjId(pNode) );
    return Counter;
}